

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O0

MatrixXd * Tools::CalculateJacobian(MatrixXd *__return_storage_ptr__,VectorXd *x_state)

{
  CoeffReturnType pdVar1;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar2;
  ostream *this;
  double dVar3;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  Scalar local_130;
  Scalar local_128;
  double local_120;
  double local_118;
  Scalar local_110;
  Scalar local_108;
  double local_100;
  double local_f8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_f0;
  float local_cc;
  float local_c8;
  float dvdr3;
  float dvdr1;
  float dvdr2;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_60;
  float local_40;
  float local_3c;
  float vy;
  float vx;
  float py;
  float local_28;
  int local_24;
  float px;
  undefined1 local_19;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *local_18;
  VectorXd *x_state_local;
  MatrixXd *Hj;
  
  local_19 = 0;
  px = 4.2039e-45;
  local_24 = 4;
  local_18 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state;
  x_state_local = (VectorXd *)__return_storage_ptr__;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,(int *)&px,&local_24);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(local_18,0)
  ;
  local_28 = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(local_18,1)
  ;
  vy = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(local_18,2)
  ;
  local_3c = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(local_18,3)
  ;
  local_40 = (float)*pdVar1;
  dVar3 = std::fabs((double)(ulong)(uint)local_28);
  if ((0.001 <= SUB84(dVar3,0)) ||
     (dVar3 = std::fabs((double)(ulong)(uint)vy), 0.001 <= SUB84(dVar3,0))) {
    dvdr3 = local_28 * local_28 + vy * vy;
    dVar3 = std::sqrt((double)(ulong)(uint)dvdr3);
    local_c8 = SUB84(dVar3,0);
    local_cc = local_c8 * dvdr3;
    local_f8 = (double)(local_28 / local_c8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_f0,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
               &local_f8);
    local_100 = (double)(vy / local_c8);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_f0,&local_100);
    local_108 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_108);
    local_110 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_110);
    local_118 = (double)(-vy / dvdr3);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_118);
    local_120 = (double)(local_28 / dvdr3);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_120);
    local_128 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_128);
    local_130 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_130);
    local_138 = (double)((vy * (local_3c * vy - local_40 * local_28)) / local_cc);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_138);
    local_140 = (double)((local_28 * (local_40 * local_28 - local_3c * vy)) / local_cc);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_140);
    local_148 = (double)(local_28 / local_c8);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_148);
    local_150 = (double)(vy / local_c8);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar2,&local_150)
    ;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_f0)
    ;
  }
  else {
    local_68 = 0.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_60,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
               &local_68);
    local_70 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_60,&local_70);
    local_78 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_78);
    local_80 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_80);
    local_88 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_88);
    local_90 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_90);
    local_98 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_98);
    local_a0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_a0);
    local_a8 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_a8);
    local_b0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_b0);
    local_b8 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_b8);
    _dvdr1 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
              (pCVar2,(Scalar *)&dvdr1);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_60)
    ;
    this = std::operator<<((ostream *)&std::cout,"Division by zero");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return __return_storage_ptr__;
}

Assistant:

MatrixXd Tools::CalculateJacobian(const VectorXd& x_state) {

    MatrixXd Hj(3,4);

    //recover state parameters
    float px = x_state(0);
    float py = x_state(1);
    float vx = x_state(2);
    float vy = x_state(3);
    
    //check division by zero
    if (fabs(px)<0.001 && fabs(py)<0.001) {
        Hj << 0, 0, 0, 0,
              0, 0, 0, 0,
              0, 0, 0, 0;
	std::cout << "Division by zero" << std::endl;
    } else {
        //compute the Jacobian matrix
        float dvdr2 = px*px + py*py;
        float dvdr1 = sqrt(dvdr2);
        float dvdr3 = dvdr1 * dvdr2;
        
        Hj << px/dvdr1,               py/dvdr1,               0,        0,
              -py/dvdr2,              px/dvdr2,               0,        0,
              py*(vx*py-vy*px)/dvdr3, px*(vy*px-vx*py)/dvdr3, px/dvdr1, py/dvdr1;
    }
    
    return Hj;


}